

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_init.cpp
# Opt level: O0

void tracing_layer::createAPITracerContextImp(void)

{
  APITracerContextImp *this;
  
  this = (APITracerContextImp *)operator_new(0xb8);
  APITracerContextImp::APITracerContextImp(this);
  pGlobalAPITracerContextImp = this;
  return;
}

Assistant:

void __attribute__((constructor)) createAPITracerContextImp() {
        pGlobalAPITracerContextImp = new struct APITracerContextImp;
    }